

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

string * __thiscall Tokenizer::type(string *__return_storage_ptr__,Tokenizer *this,string *token)

{
  int iVar1;
  size_type sVar2;
  const_iterator cVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 auVar8 [12];
  char *local_30;
  
  sVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::count
                    (&this->symbol_map,(token->_M_dataplus)._M_p);
  if (sVar2 == 0) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(this->keyword_map)._M_t,token);
    if ((_Rb_tree_header *)cVar3._M_node == &(this->keyword_map)._M_t._M_impl.super__Rb_tree_header)
    {
      pcVar6 = (token->_M_dataplus)._M_p;
      if (*pcVar6 != '_') {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        *piVar4 = 0;
        lVar5 = strtol(pcVar6,&local_30,10);
        if (local_30 == pcVar6) {
          std::__throw_invalid_argument("stoi");
        }
        else if (((int)lVar5 == lVar5) && (*piVar4 != 0x22)) {
          if (*piVar4 == 0) {
            *piVar4 = iVar1;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"INT_CONST","");
          return __return_storage_ptr__;
        }
        auVar8 = std::__throw_out_of_range("stoi");
        if (auVar8._8_4_ == 1) {
          __cxa_begin_catch(auVar8._0_8_);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"IDENTIFIER","");
          __cxa_end_catch();
          return __return_storage_ptr__;
        }
        _Unwind_Resume(auVar8._0_8_);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "STRING_CONST";
      pcVar6 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "KEYWORD";
      pcVar6 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "SYMBOL";
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::type(const std::string& token) {
    if (symbol_map.count(token[0]) > 0) {
        return "SYMBOL";
    }

    else if (keyword_map.count(token) > 0) {
        return "KEYWORD";
    }

    else if (token[0] == '_') {
        return "STRING_CONST";
    }

    try {
        int val = std::stoi(token);
        return "INT_CONST";
    }
    catch (std::exception& e) {
        return "IDENTIFIER";
    }
}